

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void __thiscall Assimp::Logger::debug(Logger *this,char *message)

{
  size_t sVar1;
  char *message_local;
  Logger *this_local;
  
  sVar1 = strlen(message);
  if (sVar1 < 0x401) {
    (*this->_vptr_Logger[4])(this,message);
  }
  return;
}

Assistant:

void Logger::debug(const char* message) {

    // SECURITY FIX: otherwise it's easy to produce overruns since
    // sometimes importers will include data from the input file
    // (i.e. node names) in their messages.
    if (strlen(message)>MAX_LOG_MESSAGE_LENGTH) {
        return;
    }
    return OnDebug(message);
}